

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

void emitASMArray(vector<unsigned_char,_std::allocator<unsigned_char>_> *data,string *name,
                 ostream *os)

{
  long lVar1;
  ostream *poVar2;
  size_t i;
  pointer puVar3;
  
  poVar2 = std::operator<<(os,(string *)name);
  std::operator<<(poVar2,":");
  for (puVar3 = (pointer)0x0;
      puVar3 < (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish +
               -(long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start; puVar3 = puVar3 + 1) {
    if (((ulong)puVar3 & 0xf) == 0) {
      std::operator<<(os,"\n\tDB ");
    }
    poVar2 = std::operator<<(os,"$");
    poVar2 = std::operator<<(poVar2,0x30);
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 2;
    *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) | 0x4000;
    std::ostream::operator<<
              ((ostream *)poVar2,
               (uint)puVar3[(long)(data->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start]);
    if (puVar3 != (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish +
                  ~(ulong)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                          _M_impl.super__Vector_impl_data._M_start) {
      std::operator<<(os,", ");
    }
  }
  std::endl<char,std::char_traits<char>>(os);
  return;
}

Assistant:

void emitASMArray(
	const std::vector<unsigned char> &data,
	const std::string &name,
	std::ostream &os
) {
	os << name << ":";
	for(size_t i = 0; i < data.size(); ++i) {
		if(i % 16 == 0) os << "\n\tDB ";
		os << "$" << std::setfill('0') << std::setw(2) << std::hex << std::uppercase << (int)data[i];
		if(i != data.size()-1) os << ", ";
	}
	os << std::endl;
}